

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderBasicData *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KStringStream ss;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Transponder Basic Data:");
  Mode5TransponderStatus::GetAsString_abi_cxx11_(&local_1e0,&this->m_Status);
  UTILS::IndentString(&local_1c0,&local_1e0,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Personal ID Number: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16PIN);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Message Formats:    ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  EnhancedMode1Code::GetAsString_abi_cxx11_(&local_220,&this->m_EM1Code);
  UTILS::IndentString(&local_200,&local_220,Tabs_00,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"National Origin:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NationalOrigin);
  poVar1 = std::operator<<(poVar1,"\n");
  Mode5TransponderSupplementalData::GetAsString_abi_cxx11_(&local_240,&this->m_SupplementalData);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  ENUMS::GetEnumAsStringNavigationSource_abi_cxx11_
            (&local_260,(ENUMS *)(ulong)this->m_ui8NavSrc,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Figure Of Merit:    ");
  poVar1 = std::operator<<(poVar1,this->m_ui8FigMerit);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderBasicData::GetAsString() const
{
    KStringStream ss;

    ss << "Mode 5 Transponder Basic Data:"
        << IndentString( m_Status.GetAsString() )
        << "Personal ID Number: " << m_ui16PIN            << "\n"
        << "Message Formats:    " << m_ui32MsgFormats     << "\n"
        << IndentString( m_EM1Code.GetAsString() )
        << "National Origin:    " << m_ui16NationalOrigin << "\n"
        << m_SupplementalData.GetAsString()
        << GetEnumAsStringNavigationSource( m_ui8NavSrc ) << "\n"
        << "Figure Of Merit:    " << m_ui8FigMerit        << "\n";

    return ss.str();
}